

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btLemkeAlgorithm.cpp
# Opt level: O2

void __thiscall
btLemkeAlgorithm::GaussJordanEliminationStep
          (btLemkeAlgorithm *this,btMatrixXf *A,int pivotRowIndex,int pivotColumnIndex,
          btAlignedObjectArray<int> *basis)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  uint uVar5;
  ulong uVar6;
  int j;
  ulong uVar7;
  float *pfVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  float *pfVar12;
  int i;
  
  uVar5 = A->m_cols;
  pfVar12 = (A->m_storage).m_data;
  fVar1 = pfVar12[(int)(uVar5 * pivotRowIndex + pivotColumnIndex)];
  iVar9 = A->m_setElemOperations;
  uVar11 = 0;
  uVar10 = 0;
  if (0 < (int)uVar5) {
    uVar10 = (ulong)uVar5;
  }
  uVar6 = (ulong)(uint)A->m_rows;
  if (A->m_rows < 1) {
    uVar6 = uVar11;
  }
  pfVar8 = pfVar12;
  for (; uVar11 != uVar6; uVar11 = uVar11 + 1) {
    if (uVar11 != (uint)pivotRowIndex) {
      for (uVar7 = 0; uVar10 != uVar7; uVar7 = uVar7 + 1) {
        if ((uint)pivotColumnIndex != uVar7) {
          fVar2 = pfVar12[(long)(int)(uVar5 * pivotRowIndex) + uVar7];
          fVar3 = pfVar12[(long)pivotColumnIndex + uVar11 * (long)(int)uVar5];
          fVar4 = pfVar8[uVar7];
          iVar9 = iVar9 + 1;
          A->m_setElemOperations = iVar9;
          pfVar8[uVar7] = fVar2 * fVar3 * (-1.0 / fVar1) + fVar4;
        }
      }
    }
    pfVar8 = pfVar8 + (int)uVar5;
  }
  for (iVar9 = 0; iVar9 < (int)uVar5; iVar9 = iVar9 + 1) {
    btMatrixX<float>::mulElem(A,pivotRowIndex,iVar9,-(-1.0 / fVar1));
    uVar5 = A->m_cols;
  }
  iVar9 = A->m_setElemOperations;
  uVar11 = 0;
  uVar10 = (ulong)(uint)A->m_rows;
  if (A->m_rows < 1) {
    uVar10 = uVar11;
  }
  pfVar12 = (A->m_storage).m_data + pivotColumnIndex;
  for (; uVar10 != uVar11; uVar11 = uVar11 + 1) {
    if ((uint)pivotRowIndex != uVar11) {
      iVar9 = iVar9 + 1;
      A->m_setElemOperations = iVar9;
      *pfVar12 = 0.0;
    }
    pfVar12 = pfVar12 + (int)uVar5;
  }
  return;
}

Assistant:

void btLemkeAlgorithm::GaussJordanEliminationStep(btMatrixXu& A, int pivotRowIndex, int pivotColumnIndex, const btAlignedObjectArray<int>& basis) 
{

	btScalar a = -1 / A(pivotRowIndex, pivotColumnIndex);
#ifdef BT_DEBUG_OSTREAM
	cout << A << std::endl;
#endif

    for (int i = 0; i < A.rows(); i++)
	{
      if (i != pivotRowIndex)
	  {
        for (int j = 0; j < A.cols(); j++)
		{
          if (j != pivotColumnIndex)
		  {
			  btScalar v = A(i, j);
			  v += A(pivotRowIndex, j) * A(i, pivotColumnIndex) * a;
            A.setElem(i, j, v);
		  }
		}
	  }
	}

#ifdef BT_DEBUG_OSTREAM
	cout << A << std::endl;
#endif //BT_DEBUG_OSTREAM
    for (int i = 0; i < A.cols(); i++) 
	{
      A.mulElem(pivotRowIndex, i,-a);
    }
#ifdef BT_DEBUG_OSTREAM
	cout << A << std::endl;
#endif //#ifdef BT_DEBUG_OSTREAM

    for (int i = 0; i < A.rows(); i++)
	{
      if (i != pivotRowIndex)
	  {
        A.setElem(i, pivotColumnIndex,0);
	  }
	}
#ifdef BT_DEBUG_OSTREAM
	cout << A << std::endl;
#endif //#ifdef BT_DEBUG_OSTREAM
  }